

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char16_t_*>
fmt::v8::detail::format_decimal<char16_t,unsigned_long>(char16_t *out,unsigned_long value,int size)

{
  int iVar1;
  char16_t *pcVar2;
  format_decimal_result<char16_t_*> fVar3;
  
  iVar1 = do_count_digits(value);
  if (iVar1 <= size) {
    pcVar2 = out + (long)size + -1;
    for (; 99 < value; value = value / 100) {
      pcVar2[-1] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [(value % 100) * 2];
      *pcVar2 = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                       [(value % 100) * 2 + 1];
      pcVar2 = pcVar2 + -2;
    }
    if (value < 10) {
      *pcVar2 = (ushort)value | 0x30;
    }
    else {
      pcVar2[-1] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [value * 2];
      *pcVar2 = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                       [value * 2 + 1];
      pcVar2 = pcVar2 + -1;
    }
    fVar3.end = out + size;
    fVar3.begin = pcVar2;
    return fVar3;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x45e,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}